

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.h
# Opt level: O0

poly * __thiscall poly::operator+=(poly *this,poly *o)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  ulong local_20;
  size_t i;
  poly *o_local;
  poly *this_local;
  
  iVar2 = bits(this);
  iVar3 = bits(o);
  if (iVar2 == iVar3) {
    local_20 = 0;
    while( true ) {
      sVar4 = std::__cxx1998::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&(this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      if (sVar4 <= local_20) break;
      pvVar5 = std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&o->x,local_20);
      uVar1 = *pvVar5;
      pvVar6 = std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->x,local_20);
      *pvVar6 = uVar1 ^ *pvVar6;
      local_20 = local_20 + 1;
    }
    this->_degree = -1;
    return this;
  }
  __assert_fail("bits() == o.bits()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/uranix[P]factormod/poly.h"
                ,0x5f,"poly &poly::operator+=(const poly &)");
}

Assistant:

poly &operator+=(const poly &o) {
        assert(bits() == o.bits());
        for (size_t i = 0; i < x.size(); i++)
            x[i] ^= o.x[i];
        _degree = -1;
        return *this;
    }